

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.h
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::AddRebuildManifestOutputs(cmGlobalNinjaGenerator *this,cmNinjaDeps *outputs)

{
  char *__s;
  allocator<char> local_59;
  string local_58;
  string local_38;
  cmNinjaDeps *local_18;
  cmNinjaDeps *outputs_local;
  cmGlobalNinjaGenerator *this_local;
  
  __s = NINJA_BUILD_FILE;
  local_18 = outputs;
  outputs_local = (cmNinjaDeps *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
  NinjaOutputPath(&local_38,this,&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(outputs,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

virtual void AddRebuildManifestOutputs(cmNinjaDeps& outputs) const
  {
    outputs.push_back(this->NinjaOutputPath(NINJA_BUILD_FILE));
  }